

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::session_impl::copy_pertinent_channels
          (session_impl *this,peer_class_set *set,int channel,bandwidth_channel **dst,int max)

{
  int iVar1;
  peer_class_t c;
  int iVar2;
  peer_class *ppVar3;
  bandwidth_channel *chan;
  peer_class *pc;
  int i;
  int num_copied;
  int num_channels;
  int max_local;
  bandwidth_channel **dst_local;
  int channel_local;
  peer_class_set *set_local;
  session_impl *this_local;
  
  iVar1 = peer_class_set::num_classes(set);
  pc._4_4_ = 0;
  pc._0_4_ = 0;
  do {
    if (iVar1 <= (int)pc) {
      return pc._4_4_;
    }
    c = peer_class_set::class_at(set,(int)pc);
    ppVar3 = peer_class_pool::at(&this->m_classes,c);
    if (ppVar3 != (peer_class *)0x0) {
      iVar2 = bandwidth_channel::throttle
                        ((bandwidth_channel *)(&ppVar3->priority + (long)channel * 3 + -7));
      if (iVar2 != 0) {
        dst[pc._4_4_] = (bandwidth_channel *)(&ppVar3->priority + (long)channel * 3 + -7);
        pc._4_4_ = pc._4_4_ + 1;
        if (pc._4_4_ == max) {
          return pc._4_4_;
        }
      }
    }
    pc._0_4_ = (int)pc + 1;
  } while( true );
}

Assistant:

int session_impl::copy_pertinent_channels(peer_class_set const& set
		, int channel, bandwidth_channel** dst, int const max)
	{
		int num_channels = set.num_classes();
		int num_copied = 0;
		for (int i = 0; i < num_channels; ++i)
		{
			peer_class* pc = m_classes.at(set.class_at(i));
			TORRENT_ASSERT(pc);
			if (pc == nullptr) continue;
			bandwidth_channel* chan = &pc->channel[channel];
			// no need to include channels that don't have any bandwidth limits
			if (chan->throttle() == 0) continue;
			dst[num_copied] = chan;
			++num_copied;
			if (num_copied == max) break;
		}
		return num_copied;
	}